

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O2

void __thiscall
TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontSym<double>_>::EquationsToDecompose
          (TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontSym<double>_> *this,
          TPZVec<long> *destinationindex,int64_t *lower_eq,int64_t *upper_eq)

{
  int *piVar1;
  long *plVar2;
  int *piVar3;
  long lVar4;
  long lVar5;
  
  plVar2 = destinationindex->fStore;
  piVar3 = (this->fNumElConnected).fStore;
  lVar5 = 0;
  lVar4 = destinationindex->fNElements;
  if (destinationindex->fNElements < 1) {
    lVar4 = lVar5;
  }
  for (; lVar4 != lVar5; lVar5 = lVar5 + 1) {
    piVar1 = piVar3 + plVar2[lVar5];
    *piVar1 = *piVar1 + -1;
  }
  lVar4 = this->fLastDecomposed;
  *upper_eq = lVar4;
  *lower_eq = lVar4 + 1;
  piVar3 = (this->fNumElConnected).fStore;
  lVar4 = *upper_eq;
  while ((lVar4 < this->fNumEq + -1 && (piVar3[lVar4 + 1] == 0))) {
    lVar4 = lVar4 + 1;
    *upper_eq = lVar4;
  }
  this->fLastDecomposed = lVar4;
  return;
}

Assistant:

void TPZFrontMatrix<TVar,store, front>::EquationsToDecompose(TPZVec<int64_t> &destinationindex, int64_t &lower_eq, int64_t &upper_eq)
{
	int64_t i;
	int64_t loop_limit, global;
	loop_limit = destinationindex.NElements();
	for(i=0;i<loop_limit;i++){
		global = destinationindex[i];
		fNumElConnected[global]--;
	}
	upper_eq=fLastDecomposed;
	lower_eq=fLastDecomposed+1;
	while(upper_eq < fNumEq-1 && fNumElConnected[upper_eq+1]==0) upper_eq++;
	fLastDecomposed=upper_eq;
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
	{
		std::stringstream sout;
		sout << "Constructor frontmatrix lower_eq "<< lower_eq << " upper_eq " << upper_eq << " fNumElConnected " << fNumElConnected;
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
}